

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O3

void __thiscall f8n::db::Statement::BindTextW(Statement *this,int position,wstring *bindText)

{
  sqlite3_bind_text16(this->stmt,position + 1,*(void **)bindText,-1,
                      (_func_void_void_ptr *)0xffffffffffffffff);
  return;
}

Assistant:

void Statement::BindTextW(int position, const std::wstring &bindText) {
    sqlite3_bind_text16(
        this->stmt,
        position + 1,
        bindText.c_str(),
        -1,
        SQLITE_TRANSIENT);
}